

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupPrefix
          (DOMNodeImpl *this,XMLCh *namespaceURI,DOMElement *originalElement)

{
  DOMNodeImpl *currentNode;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNodeImpl *pDVar6;
  undefined4 extraout_var_03;
  DOMNodeImpl *pDVar7;
  DOMNodeImpl *str1;
  DOMNodeImpl *str1_00;
  DOMNodeImpl *str1_01;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  DOMNode *p;
  XMLSize_t i;
  long lVar8;
  DOMNodeImpl *this_00;
  XMLCh *pXVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  do {
    currentNode = (DOMNodeImpl *)this->fContainingNode;
    iVar2 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
    iVar3 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    if ((((XMLCh *)CONCAT44(extraout_var,iVar2) != (XMLCh *)0x0) &&
        (bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),namespaceURI),
        pXVar5 != (XMLCh *)0x0)) && (bVar1)) {
      iVar2 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])(originalElement,pXVar5);
      if (((XMLCh *)CONCAT44(extraout_var_01,iVar2) != (XMLCh *)0x0) &&
         (bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar2),namespaceURI), bVar1))
      {
        return pXVar5;
      }
    }
    this_00 = currentNode;
    iVar2 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar2 != '\0') {
      this_00 = currentNode;
      iVar2 = (*(code *)currentNode->fContainingNode[0xb]._vptr_DOMNode)();
      pDVar6 = (DOMNodeImpl *)CONCAT44(extraout_var_02,iVar2);
      if (pDVar6 != (DOMNodeImpl *)0x0) {
        this_00 = pDVar6;
        iVar2 = (*((DOMNode *)&pDVar6->fContainingNode)->_vptr_DOMNode[5])();
        for (lVar8 = 0; CONCAT44(extraout_var_03,iVar2) != lVar8; lVar8 = lVar8 + 1) {
          iVar3 = (*((DOMNode *)&pDVar6->fContainingNode)->_vptr_DOMNode[3])(pDVar6,lVar8);
          pDVar7 = (DOMNodeImpl *)CONCAT44(extraout_var_04,iVar3);
          iVar3 = (*((DOMNode *)&pDVar7->fContainingNode)->_vptr_DOMNode[0x17])(pDVar7);
          str1 = (DOMNodeImpl *)CONCAT44(extraout_var_05,iVar3);
          iVar3 = (*((DOMNode *)&pDVar7->fContainingNode)->_vptr_DOMNode[3])(pDVar7);
          str1_00 = (DOMNodeImpl *)CONCAT44(extraout_var_06,iVar3);
          this_00 = pDVar7;
          iVar3 = (*((DOMNode *)&pDVar7->fContainingNode)->_vptr_DOMNode[0x16])();
          str1_01 = (DOMNodeImpl *)CONCAT44(extraout_var_07,iVar3);
          if (((str1_01 != (DOMNodeImpl *)0x0) &&
              (bVar1 = XMLString::equals((XMLCh *)str1_01,(XMLCh *)XMLUni::fgXMLNSURIName),
              this_00 = str1_01, str1 != (DOMNodeImpl *)0x0)) &&
             ((bVar1 && ((bVar1 = XMLString::equals((XMLCh *)str1,(XMLCh *)XMLUni::fgXMLNSString),
                         this_00 = str1, bVar1 &&
                         (bVar1 = XMLString::equals((XMLCh *)str1_00,namespaceURI),
                         this_00 = str1_00, bVar1)))))) {
            iVar3 = (*((DOMNode *)&pDVar7->fContainingNode)->_vptr_DOMNode[0x18])(pDVar7);
            this_00 = (DOMNodeImpl *)originalElement;
            iVar4 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])
                              (originalElement,(XMLCh *)CONCAT44(extraout_var_08,iVar3));
            pDVar7 = (DOMNodeImpl *)CONCAT44(extraout_var_09,iVar4);
            if ((pDVar7 != (DOMNodeImpl *)0x0) &&
               (bVar1 = XMLString::equals((XMLCh *)pDVar7,namespaceURI), this_00 = pDVar7, bVar1)) {
              return (XMLCh *)CONCAT44(extraout_var_08,iVar3);
            }
          }
        }
      }
    }
    p = getElementAncestor(this_00,(DOMNode *)currentNode);
    if (p == (DOMNode *)0x0) {
      return (XMLCh *)0x0;
    }
    this = castToNodeImpl(p);
  } while( true );
}

Assistant:

const XMLCh* DOMNodeImpl::lookupPrefix(const XMLCh* const namespaceURI, DOMElement *originalElement) const {
    const DOMNode *thisNode = getContainingNode();

    const XMLCh* ns = thisNode->getNamespaceURI();
    // REVISIT: if no prefix is available is it null or empty string, or
    //          could be both?
    const XMLCh* prefix = thisNode->getPrefix();

    if (ns != 0 && XMLString::equals(ns,namespaceURI) && prefix != 0) {
        const XMLCh* foundNamespace =  originalElement->lookupNamespaceURI(prefix);
        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
            return prefix;
        }
    }
    if (thisNode->hasAttributes()) {
        DOMNamedNodeMap *nodeMap = thisNode->getAttributes();

        if(nodeMap != 0) {
            XMLSize_t length = nodeMap->getLength();

            for (XMLSize_t i = 0;i < length;i++) {
                DOMNode *attr = nodeMap->item(i);
                const XMLCh* attrPrefix = attr->getPrefix();
                const XMLCh* value = attr->getNodeValue();

                ns = attr->getNamespaceURI();

                if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                    // DOM Level 2 nodes
                    if ((attrPrefix != 0 && XMLString::equals(attrPrefix, XMLUni::fgXMLNSString)) &&
                        XMLString::equals(value, namespaceURI)) {
                        const XMLCh* localname= attr->getLocalName();
                        const XMLCh* foundNamespace = originalElement->lookupNamespaceURI(localname);
                        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
                            return localname;
                        }
                    }
                }
            }
        }
    }
    DOMNode *ancestor = getElementAncestor(thisNode);
    if (ancestor != 0) {
        return castToNodeImpl(ancestor)->lookupPrefix(namespaceURI, originalElement);
    }
    return 0;
}